

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  FileOptions *pFVar1;
  _anonymous_namespace_ *this;
  long lVar2;
  long lVar3;
  long *plVar4;
  string *extraout_RAX;
  string *psVar5;
  AlphaNum *in_R8;
  string_view full_name;
  string classname;
  string php_namespace;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AlphaNum local_a8;
  AlphaNum local_78;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  GeneratedClassName_abi_cxx11_((string *)local_e8,(php *)desc,(EnumDescriptor *)options);
  pFVar1 = desc->file_->options_;
  if ((*(byte *)((long)&pFVar1->field_0 + 0x18) & 0x80) == 0) {
    psVar5 = desc->file_->package_;
    this = (_anonymous_namespace_ *)psVar5->_M_string_length;
    if (this != (_anonymous_namespace_ *)0x0) {
      full_name._M_str._0_1_ = options->is_descriptor;
      full_name._M_len = (size_t)(psVar5->_M_dataplus)._M_p;
      full_name._M_str._1_7_ = 0;
      php::(anonymous_namespace)::PhpName_abi_cxx11_
                ((string *)&local_c8,this,full_name,(Options *)in_R8);
      goto LAB_001e3a4f;
    }
  }
  else {
    plVar4 = (long *)((ulong)(pFVar1->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ &
                     0xfffffffffffffffc);
    lVar2 = plVar4[1];
    if (lVar2 != 0) {
      lVar3 = *plVar4;
      local_c8._M_allocated_capacity = (size_type)&local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,lVar3,lVar2 + lVar3);
      goto LAB_001e3a4f;
    }
  }
  local_c8._M_allocated_capacity = (size_type)&local_b8;
  local_c8._8_8_ = 0;
  local_b8._M_local_buf[0] = '\0';
LAB_001e3a4f:
  if (local_c8._8_8_ == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((string *)local_e8._0_8_ == (string *)(local_e8 + 0x10)) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8._17_7_,local_e8[0x10]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8._24_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8._17_7_,local_e8[0x10]);
    }
    __return_storage_ptr__->_M_string_length = local_e8._8_8_;
    local_e8._8_8_ = 0;
    local_e8[0x10] = '\0';
    local_e8._0_8_ = (string *)(local_e8 + 0x10);
  }
  else {
    local_48 = local_c8._8_8_;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_allocated_capacity;
    local_78.piece_._M_len = 1;
    local_78.piece_._M_str = "\\";
    local_a8.piece_._M_len = local_e8._8_8_;
    local_a8.piece_._M_str = (char *)local_e8._0_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_allocated_capacity != &local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  psVar5 = (string *)(local_e8 + 0x10);
  if ((string *)local_e8._0_8_ != psVar5) {
    operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, const Options& options) {
  std::string classname = GeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return absl::StrCat(php_namespace, "\\", classname);
  }
  return classname;
}